

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

string * __thiscall
soul::CodeLocation::getFilename_abi_cxx11_(string *__return_storage_ptr__,CodeLocation *this)

{
  bool bVar1;
  SourceCodeText *pSVar2;
  CodeLocation *this_local;
  
  bVar1 = RefCountedPtr<soul::SourceCodeText>::operator!=(&this->sourceCode,(SourceCodeText *)0x0);
  if (bVar1) {
    pSVar2 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pSVar2->filename);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocation::getFilename() const
{
    if (sourceCode != nullptr)
        return sourceCode->filename;

    return {};
}